

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS
ref_gather_cell(REF_NODE ref_node,REF_CELL ref_cell,REF_BOOL faceid_insted_of_c2n,REF_BOOL always_id
               ,REF_BOOL swap_endian,REF_BOOL sixty_four_bit,REF_BOOL select_faceid,REF_INT faceid,
               REF_BOOL pad,FILE *file)

{
  undefined8 uVar1;
  char *pcVar2;
  undefined4 uVar3;
  REF_LONG RVar4;
  REF_LONG RVar5;
  REF_STATUS RVar6;
  uint uVar7;
  size_t sVar8;
  undefined8 local_470;
  long local_468;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_LONG ref_private_status_reis_bi_13;
  REF_LONG ref_private_status_reis_ai_13;
  char *yp_13;
  char *xp_13;
  int y_13;
  REF_LONG ref_private_status_reis_bi_12;
  REF_LONG ref_private_status_reis_ai_12;
  char *yp_12;
  char *xp_12;
  long y_12;
  REF_LONG ref_private_status_reis_bi_11;
  REF_LONG ref_private_status_reis_ai_11;
  char *yp_11;
  char *xp_11;
  int y_11;
  REF_INT zero_1;
  REF_LONG ref_private_status_reis_bi_10;
  REF_LONG ref_private_status_reis_ai_10;
  char *yp_10;
  char *xp_10;
  size_t sStack_3b0;
  int y_10;
  REF_LONG ref_private_status_reis_bi_9;
  REF_LONG ref_private_status_reis_ai_9;
  char *yp_9;
  char *xp_9;
  long y_9;
  REF_LONG ref_private_status_reis_bi_8;
  REF_LONG ref_private_status_reis_ai_8;
  char *yp_8;
  char *xp_8;
  size_t sStack_360;
  int y_8;
  REF_LONG ref_private_status_reis_bi_7;
  REF_LONG ref_private_status_reis_ai_7;
  char *yp_7;
  char *xp_7;
  long y_7;
  REF_LONG n4_1;
  REF_LONG n3_1;
  REF_LONG n2_1;
  REF_LONG n1_1;
  REF_LONG n0_1;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_LONG ref_private_status_reis_bi_6;
  REF_LONG ref_private_status_reis_ai_6;
  char *yp_6;
  char *xp_6;
  size_t sStack_2e0;
  int y_6;
  REF_LONG ref_private_status_reis_bi_5;
  REF_LONG ref_private_status_reis_ai_5;
  char *yp_5;
  char *xp_5;
  long y_5;
  REF_LONG ref_private_status_reis_bi_4;
  REF_LONG ref_private_status_reis_ai_4;
  char *yp_4;
  char *xp_4;
  int y_4;
  REF_INT zero;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  char *yp_3;
  char *xp_3;
  size_t sStack_268;
  int y_3;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  char *yp_2;
  char *xp_2;
  long y_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  char *yp_1;
  char *xp_1;
  size_t sStack_218;
  int y_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  char *yp;
  char *xp;
  long y;
  REF_LONG n4;
  REF_LONG n3;
  REF_LONG n2;
  REF_LONG n1;
  REF_LONG n0;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT proc;
  REF_LONG c2n_long;
  void *pvStack_1b0;
  REF_INT c2n_int;
  REF_GLOB *c2n;
  REF_INT local_1a0;
  REF_INT ncell;
  REF_INT size_per;
  REF_INT node_per;
  REF_LONG globals [28];
  REF_INT nodes [27];
  int local_44;
  int local_40;
  REF_INT part;
  REF_INT node;
  REF_INT cell;
  REF_MPI ref_mpi;
  REF_BOOL sixty_four_bit_local;
  REF_BOOL swap_endian_local;
  REF_BOOL always_id_local;
  REF_BOOL faceid_insted_of_c2n_local;
  REF_CELL ref_cell_local;
  REF_NODE ref_node_local;
  
  _node = ref_node->ref_mpi;
  ncell = ref_cell->node_per;
  local_1a0 = ref_cell->size_per;
  ref_mpi._0_4_ = sixty_four_bit;
  ref_mpi._4_4_ = swap_endian;
  sixty_four_bit_local = always_id;
  swap_endian_local = faceid_insted_of_c2n;
  _always_id_local = ref_cell;
  ref_cell_local = (REF_CELL)ref_node;
  if (_node->id == 0) {
    for (part = 0; part < _always_id_local->max; part = part + 1) {
      RVar6 = ref_cell_nodes(_always_id_local,part,(REF_INT *)(globals + 0x1b));
      if (RVar6 == 0) {
        n0._0_4_ = ref_cell_part(_always_id_local,(REF_NODE)ref_cell_local,part,&local_44);
        uVar3 = c2n_long._4_4_;
        pcVar2 = _ref_private_macro_code_rss;
        if ((uint)n0 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x79a,"ref_gather_cell",(ulong)(uint)n0,"part");
          return (uint)n0;
        }
        if ((_node->id == local_44) &&
           ((select_faceid == 0 || (nodes[(long)_always_id_local->node_per + -2] == faceid)))) {
          for (local_40 = 0; local_40 < ncell; local_40 = local_40 + 1) {
            if (((nodes[(long)local_40 + -2] < 0) ||
                (ref_cell_local->last_node_is_an_id <= nodes[(long)local_40 + -2])) ||
               (*(long *)(*(long *)&ref_cell_local->edge_per + (long)nodes[(long)local_40 + -2] * 8)
                < 0)) {
              local_468 = -1;
            }
            else {
              local_468 = *(long *)(*(long *)&ref_cell_local->edge_per +
                                   (long)nodes[(long)local_40 + -2] * 8);
            }
            *(long *)(&size_per + (long)local_40 * 2) = local_468 + 1;
          }
          (&size_per + (long)ncell * 2)[0] = 0;
          (&size_per + (long)ncell * 2)[1] = 0;
          if (ncell < local_1a0) {
            *(long *)(&size_per + (long)ncell * 2) = (long)nodes[(long)ncell + -2];
          }
          RVar5 = globals[1];
          RVar4 = globals[0];
          if ((sixty_four_bit_local != 0) && (_always_id_local->type == REF_CELL_PYR)) {
            n1 = _size_per;
            n2 = globals[2];
            n3 = globals[3];
            n4 = globals[0];
            y = globals[1];
            globals[0] = globals[2];
            globals[1] = globals[3];
            globals[2] = RVar4;
            globals[3] = RVar5;
          }
          if (swap_endian_local == 0) {
            for (local_40 = 0; uVar3 = c2n_long._4_4_, pcVar2 = _ref_private_macro_code_rss,
                local_40 < ncell; local_40 = local_40 + 1) {
              if ((REF_BOOL)ref_mpi == 0) {
                c2n_long._4_4_ = (undefined4)*(undefined8 *)(&size_per + (long)local_40 * 2);
                if (ref_mpi._4_4_ != 0) {
                  yp_3 = (char *)((long)&c2n_long + 4);
                  ref_private_status_reis_ai_3 = (long)&xp_3 + 4;
                  c2n_long._4_1_ = (undefined1)*(undefined8 *)(&size_per + (long)local_40 * 2);
                  xp_3._7_1_ = c2n_long._4_1_;
                  c2n_long._5_1_ = SUB41(uVar3,1);
                  xp_3._6_1_ = c2n_long._5_1_;
                  c2n_long._6_1_ = SUB41(uVar3,2);
                  xp_3._5_1_ = c2n_long._6_1_;
                  c2n_long._7_1_ = SUB41(uVar3,3);
                  xp_3._4_1_ = c2n_long._7_1_;
                  c2n_long._4_4_ = xp_3._4_4_;
                }
                ref_private_status_reis_bi_3 = 1;
                _y_4 = fwrite((void *)((long)&c2n_long + 4),4,1,(FILE *)file);
                if (ref_private_status_reis_bi_3 != _y_4) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x7c7,"ref_gather_cell","int cel node",ref_private_status_reis_bi_3,_y_4);
                  return 1;
                }
              }
              else {
                _ref_private_macro_code_rss = *(char **)(&size_per + (long)local_40 * 2);
                if (ref_mpi._4_4_ != 0) {
                  yp_2 = (char *)&ref_private_macro_code_rss;
                  ref_private_status_reis_ai_2 = (REF_LONG)&xp_2;
                  xp_2._7_1_ = (undefined1)ref_private_macro_code_rss;
                  ref_private_macro_code_rss._1_1_ = SUB81(pcVar2,1);
                  xp_2._6_1_ = ref_private_macro_code_rss._1_1_;
                  ref_private_macro_code_rss._2_1_ = SUB81(pcVar2,2);
                  xp_2._5_1_ = ref_private_macro_code_rss._2_1_;
                  ref_private_macro_code_rss._3_1_ = SUB81(pcVar2,3);
                  xp_2._4_1_ = ref_private_macro_code_rss._3_1_;
                  proc._0_1_ = SUB81(pcVar2,4);
                  xp_2._3_1_ = (undefined1)proc;
                  proc._1_1_ = SUB81(pcVar2,5);
                  xp_2._2_1_ = proc._1_1_;
                  proc._2_1_ = SUB81(pcVar2,6);
                  xp_2._1_1_ = proc._2_1_;
                  proc._3_1_ = SUB81(pcVar2,7);
                  xp_2._0_1_ = proc._3_1_;
                  _ref_private_macro_code_rss = xp_2;
                }
                ref_private_status_reis_bi_2 = 1;
                sStack_268 = fwrite(&ref_private_macro_code_rss,8,1,(FILE *)file);
                if (ref_private_status_reis_bi_2 != sStack_268) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x7c2,"ref_gather_cell","long cel node",ref_private_status_reis_bi_2,
                         sStack_268);
                  return 1;
                }
              }
            }
            if (pad != 0) {
              xp_4._4_4_ = 0;
              if (ref_mpi._4_4_ != 0) {
                yp_4 = (char *)((long)&xp_4 + 4);
                ref_private_status_reis_ai_4 = (REF_LONG)&xp_4;
                xp_4._3_1_ = 0;
                xp_4._2_1_ = 0;
                xp_4._1_1_ = 0;
                xp_4._0_1_ = 0;
                xp_4._4_4_ = xp_4._0_4_;
              }
              ref_private_status_reis_bi_4 = 1;
              y_5 = fwrite((void *)((long)&xp_4 + 4),4,1,(FILE *)file);
              if (ref_private_status_reis_bi_4 != y_5) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x7cd,"ref_gather_cell","zero pad",ref_private_status_reis_bi_4,y_5);
                return 1;
              }
            }
            uVar3 = c2n_long._4_4_;
            pcVar2 = _ref_private_macro_code_rss;
            if (sixty_four_bit_local != 0) {
              if ((REF_BOOL)ref_mpi == 0) {
                c2n_long._4_4_ = (undefined4)*(undefined8 *)(&size_per + (long)ncell * 2);
                if (ref_mpi._4_4_ != 0) {
                  yp_6 = (char *)((long)&c2n_long + 4);
                  ref_private_status_reis_ai_6 = (long)&xp_6 + 4;
                  c2n_long._4_1_ = (undefined1)*(undefined8 *)(&size_per + (long)ncell * 2);
                  xp_6._7_1_ = c2n_long._4_1_;
                  c2n_long._5_1_ = SUB41(uVar3,1);
                  xp_6._6_1_ = c2n_long._5_1_;
                  c2n_long._6_1_ = SUB41(uVar3,2);
                  xp_6._5_1_ = c2n_long._6_1_;
                  c2n_long._7_1_ = SUB41(uVar3,3);
                  xp_6._4_1_ = c2n_long._7_1_;
                  c2n_long._4_4_ = xp_6._4_4_;
                }
                ref_private_status_reis_bi_6 = 1;
                _ref_private_macro_code_rss_2 =
                     fwrite((void *)((long)&c2n_long + 4),4,1,(FILE *)file);
                if (ref_private_status_reis_bi_6 != _ref_private_macro_code_rss_2) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x7d8,"ref_gather_cell","int id",ref_private_status_reis_bi_6,
                         _ref_private_macro_code_rss_2);
                  return 1;
                }
              }
              else {
                _ref_private_macro_code_rss = *(char **)(&size_per + (long)ncell * 2);
                if (ref_mpi._4_4_ != 0) {
                  yp_5 = (char *)&ref_private_macro_code_rss;
                  ref_private_status_reis_ai_5 = (REF_LONG)&xp_5;
                  xp_5._7_1_ = (undefined1)ref_private_macro_code_rss;
                  ref_private_macro_code_rss._1_1_ = SUB81(pcVar2,1);
                  xp_5._6_1_ = ref_private_macro_code_rss._1_1_;
                  ref_private_macro_code_rss._2_1_ = SUB81(pcVar2,2);
                  xp_5._5_1_ = ref_private_macro_code_rss._2_1_;
                  ref_private_macro_code_rss._3_1_ = SUB81(pcVar2,3);
                  xp_5._4_1_ = ref_private_macro_code_rss._3_1_;
                  proc._0_1_ = SUB81(pcVar2,4);
                  xp_5._3_1_ = (undefined1)proc;
                  proc._1_1_ = SUB81(pcVar2,5);
                  xp_5._2_1_ = proc._1_1_;
                  proc._2_1_ = SUB81(pcVar2,6);
                  xp_5._1_1_ = proc._2_1_;
                  proc._3_1_ = SUB81(pcVar2,7);
                  xp_5._0_1_ = proc._3_1_;
                  _ref_private_macro_code_rss = xp_5;
                }
                ref_private_status_reis_bi_5 = 1;
                sStack_2e0 = fwrite(&ref_private_macro_code_rss,8,1,(FILE *)file);
                if (ref_private_status_reis_bi_5 != sStack_2e0) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x7d4,"ref_gather_cell","long id",ref_private_status_reis_bi_5,sStack_2e0)
                  ;
                  return 1;
                }
              }
            }
          }
          else if ((REF_BOOL)ref_mpi == 0) {
            c2n_long._4_4_ = (undefined4)*(undefined8 *)(&size_per + (long)ncell * 2);
            if (ref_mpi._4_4_ != 0) {
              yp_1 = (char *)((long)&c2n_long + 4);
              ref_private_status_reis_ai_1 = (long)&xp_1 + 4;
              c2n_long._4_1_ = (undefined1)*(undefined8 *)(&size_per + (long)ncell * 2);
              xp_1._7_1_ = c2n_long._4_1_;
              c2n_long._5_1_ = SUB41(uVar3,1);
              xp_1._6_1_ = c2n_long._5_1_;
              c2n_long._6_1_ = SUB41(uVar3,2);
              xp_1._5_1_ = c2n_long._6_1_;
              c2n_long._7_1_ = SUB41(uVar3,3);
              xp_1._4_1_ = c2n_long._7_1_;
              c2n_long._4_4_ = xp_1._4_4_;
            }
            ref_private_status_reis_bi_1 = 1;
            y_2 = fwrite((void *)((long)&c2n_long + 4),4,1,(FILE *)file);
            if (ref_private_status_reis_bi_1 != y_2) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x7ba,"ref_gather_cell","int id",ref_private_status_reis_bi_1,y_2);
              return 1;
            }
          }
          else {
            _ref_private_macro_code_rss = *(char **)(&size_per + (long)ncell * 2);
            if (ref_mpi._4_4_ != 0) {
              yp = (char *)&ref_private_macro_code_rss;
              ref_private_status_reis_ai = (REF_LONG)&xp;
              xp._7_1_ = (undefined1)ref_private_macro_code_rss;
              ref_private_macro_code_rss._1_1_ = SUB81(pcVar2,1);
              xp._6_1_ = ref_private_macro_code_rss._1_1_;
              ref_private_macro_code_rss._2_1_ = SUB81(pcVar2,2);
              xp._5_1_ = ref_private_macro_code_rss._2_1_;
              ref_private_macro_code_rss._3_1_ = SUB81(pcVar2,3);
              xp._4_1_ = ref_private_macro_code_rss._3_1_;
              proc._0_1_ = SUB81(pcVar2,4);
              xp._3_1_ = (undefined1)proc;
              proc._1_1_ = SUB81(pcVar2,5);
              xp._2_1_ = proc._1_1_;
              proc._2_1_ = SUB81(pcVar2,6);
              xp._1_1_ = proc._2_1_;
              proc._3_1_ = SUB81(pcVar2,7);
              xp._0_1_ = proc._3_1_;
              _ref_private_macro_code_rss = xp;
            }
            ref_private_status_reis_bi = 1;
            sStack_218 = fwrite(&ref_private_macro_code_rss,8,1,(FILE *)file);
            if (ref_private_status_reis_bi != sStack_218) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x7b6,"ref_gather_cell","long id",ref_private_status_reis_bi,sStack_218);
              return 1;
            }
          }
        }
      }
    }
  }
  if (_node->id == 0) {
    for (n0._4_4_ = 1; n0._4_4_ < _node->n; n0._4_4_ = n0._4_4_ + 1) {
      n0_1._4_4_ = ref_mpi_gather_recv(_node,(void *)((long)&c2n + 4),1,1,n0._4_4_);
      if (n0_1._4_4_ != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x7e3,"ref_gather_cell",(ulong)n0_1._4_4_,"recv ncell");
        return n0_1._4_4_;
      }
      if (0 < c2n._4_4_) {
        if (c2n._4_4_ * local_1a0 < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x7e5,"ref_gather_cell","malloc c2n of REF_GLOB negative");
          return 1;
        }
        pvStack_1b0 = malloc((long)(c2n._4_4_ * local_1a0) << 3);
        if (pvStack_1b0 == (void *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x7e5,"ref_gather_cell","malloc c2n of REF_GLOB NULL");
          return 2;
        }
        n0_1._0_4_ = ref_mpi_gather_recv(_node,pvStack_1b0,c2n._4_4_ * local_1a0,2,n0._4_4_);
        if ((uint)n0_1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x7e8,"ref_gather_cell",(ulong)(uint)n0_1,"recv c2n");
          return (uint)n0_1;
        }
        n0_1._0_4_ = 0;
        for (part = 0; uVar3 = c2n_long._4_4_, pcVar2 = _ref_private_macro_code_rss,
            part < c2n._4_4_; part = part + 1) {
          for (local_40 = 0; local_40 < ncell; local_40 = local_40 + 1) {
            *(long *)(&size_per + (long)local_40 * 2) =
                 *(long *)((long)pvStack_1b0 + (long)(local_40 + local_1a0 * part) * 8) + 1;
          }
          (&size_per + (long)ncell * 2)[0] = 0;
          (&size_per + (long)ncell * 2)[1] = 0;
          if (ncell < local_1a0) {
            *(undefined8 *)(&size_per + (long)ncell * 2) =
                 *(undefined8 *)((long)pvStack_1b0 + (long)(ncell + local_1a0 * part) * 8);
          }
          RVar5 = globals[1];
          RVar4 = globals[0];
          if ((sixty_four_bit_local != 0) && (_always_id_local->type == REF_CELL_PYR)) {
            n1_1 = _size_per;
            n2_1 = globals[2];
            n3_1 = globals[3];
            n4_1 = globals[0];
            y_7 = globals[1];
            globals[0] = globals[2];
            globals[1] = globals[3];
            globals[2] = RVar4;
            globals[3] = RVar5;
          }
          if (swap_endian_local == 0) {
            for (local_40 = 0; uVar3 = c2n_long._4_4_, pcVar2 = _ref_private_macro_code_rss,
                local_40 < ncell; local_40 = local_40 + 1) {
              if ((REF_BOOL)ref_mpi == 0) {
                c2n_long._4_4_ = (undefined4)*(undefined8 *)(&size_per + (long)local_40 * 2);
                if (ref_mpi._4_4_ != 0) {
                  yp_10 = (char *)((long)&c2n_long + 4);
                  ref_private_status_reis_ai_10 = (long)&xp_10 + 4;
                  c2n_long._4_1_ = (undefined1)*(undefined8 *)(&size_per + (long)local_40 * 2);
                  xp_10._7_1_ = c2n_long._4_1_;
                  c2n_long._5_1_ = SUB41(uVar3,1);
                  xp_10._6_1_ = c2n_long._5_1_;
                  c2n_long._6_1_ = SUB41(uVar3,2);
                  xp_10._5_1_ = c2n_long._6_1_;
                  c2n_long._7_1_ = SUB41(uVar3,3);
                  xp_10._4_1_ = c2n_long._7_1_;
                  c2n_long._4_4_ = xp_10._4_4_;
                }
                ref_private_status_reis_bi_10 = 1;
                _y_11 = fwrite((void *)((long)&c2n_long + 4),4,1,(FILE *)file);
                if (ref_private_status_reis_bi_10 != _y_11) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x816,"ref_gather_cell","int cel node",ref_private_status_reis_bi_10,_y_11
                        );
                  return 1;
                }
              }
              else {
                _ref_private_macro_code_rss = *(char **)(&size_per + (long)local_40 * 2);
                if (ref_mpi._4_4_ != 0) {
                  yp_9 = (char *)&ref_private_macro_code_rss;
                  ref_private_status_reis_ai_9 = (REF_LONG)&xp_9;
                  xp_9._7_1_ = (undefined1)ref_private_macro_code_rss;
                  ref_private_macro_code_rss._1_1_ = SUB81(pcVar2,1);
                  xp_9._6_1_ = ref_private_macro_code_rss._1_1_;
                  ref_private_macro_code_rss._2_1_ = SUB81(pcVar2,2);
                  xp_9._5_1_ = ref_private_macro_code_rss._2_1_;
                  ref_private_macro_code_rss._3_1_ = SUB81(pcVar2,3);
                  xp_9._4_1_ = ref_private_macro_code_rss._3_1_;
                  proc._0_1_ = SUB81(pcVar2,4);
                  xp_9._3_1_ = (undefined1)proc;
                  proc._1_1_ = SUB81(pcVar2,5);
                  xp_9._2_1_ = proc._1_1_;
                  proc._2_1_ = SUB81(pcVar2,6);
                  xp_9._1_1_ = proc._2_1_;
                  proc._3_1_ = SUB81(pcVar2,7);
                  xp_9._0_1_ = proc._3_1_;
                  _ref_private_macro_code_rss = xp_9;
                }
                ref_private_status_reis_bi_9 = 1;
                sStack_3b0 = fwrite(&ref_private_macro_code_rss,8,1,(FILE *)file);
                if (ref_private_status_reis_bi_9 != sStack_3b0) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x811,"ref_gather_cell","long cel node",ref_private_status_reis_bi_9,
                         sStack_3b0);
                  return 1;
                }
              }
            }
            if (pad != 0) {
              xp_11._4_4_ = 0;
              if (ref_mpi._4_4_ != 0) {
                xp_11._3_1_ = 0;
                xp_11._2_1_ = 0;
                xp_11._1_1_ = 0;
                xp_11._0_1_ = 0;
                xp_11._4_4_ = xp_11._0_4_;
              }
              sVar8 = fwrite((void *)((long)&xp_11 + 4),4,1,(FILE *)file);
              if (sVar8 != 1) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x81c,"ref_gather_cell","zero pad",1,sVar8);
                return 1;
              }
            }
            pcVar2 = _ref_private_macro_code_rss;
            if (sixty_four_bit_local != 0) {
              if ((REF_BOOL)ref_mpi == 0) {
                uVar1 = *(undefined8 *)(&size_per + (long)ncell * 2);
                c2n_long._4_4_ = (undefined4)uVar1;
                if (ref_mpi._4_4_ != 0) {
                  c2n_long._4_1_ = (undefined1)uVar1;
                  xp_13._7_1_ = c2n_long._4_1_;
                  c2n_long._5_1_ = (undefined1)((ulong)uVar1 >> 8);
                  xp_13._6_1_ = c2n_long._5_1_;
                  c2n_long._6_1_ = (undefined1)((ulong)uVar1 >> 0x10);
                  xp_13._5_1_ = c2n_long._6_1_;
                  c2n_long._7_1_ = (undefined1)((ulong)uVar1 >> 0x18);
                  xp_13._4_1_ = c2n_long._7_1_;
                  c2n_long._4_4_ = xp_13._4_4_;
                }
                sVar8 = fwrite((void *)((long)&c2n_long + 4),4,1,(FILE *)file);
                if (sVar8 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x827,"ref_gather_cell","int id",1,sVar8);
                  return 1;
                }
              }
              else {
                _ref_private_macro_code_rss = *(char **)(&size_per + (long)ncell * 2);
                if (ref_mpi._4_4_ != 0) {
                  xp_12._7_1_ = (undefined1)ref_private_macro_code_rss;
                  ref_private_macro_code_rss._1_1_ = SUB81(pcVar2,1);
                  xp_12._6_1_ = ref_private_macro_code_rss._1_1_;
                  ref_private_macro_code_rss._2_1_ = SUB81(pcVar2,2);
                  xp_12._5_1_ = ref_private_macro_code_rss._2_1_;
                  ref_private_macro_code_rss._3_1_ = SUB81(pcVar2,3);
                  xp_12._4_1_ = ref_private_macro_code_rss._3_1_;
                  proc._0_1_ = SUB81(pcVar2,4);
                  xp_12._3_1_ = (undefined1)proc;
                  proc._1_1_ = SUB81(pcVar2,5);
                  xp_12._2_1_ = proc._1_1_;
                  proc._2_1_ = SUB81(pcVar2,6);
                  xp_12._1_1_ = proc._2_1_;
                  proc._3_1_ = SUB81(pcVar2,7);
                  xp_12._0_1_ = proc._3_1_;
                  _ref_private_macro_code_rss = xp_12;
                }
                sVar8 = fwrite(&ref_private_macro_code_rss,8,1,(FILE *)file);
                if (sVar8 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x823,"ref_gather_cell","long id",1,sVar8);
                  return 1;
                }
              }
            }
          }
          else if ((REF_BOOL)ref_mpi == 0) {
            c2n_long._4_4_ = (undefined4)*(undefined8 *)(&size_per + (long)ncell * 2);
            if (ref_mpi._4_4_ != 0) {
              yp_8 = (char *)((long)&c2n_long + 4);
              ref_private_status_reis_ai_8 = (long)&xp_8 + 4;
              c2n_long._4_1_ = (undefined1)*(undefined8 *)(&size_per + (long)ncell * 2);
              xp_8._7_1_ = c2n_long._4_1_;
              c2n_long._5_1_ = SUB41(uVar3,1);
              xp_8._6_1_ = c2n_long._5_1_;
              c2n_long._6_1_ = SUB41(uVar3,2);
              xp_8._5_1_ = c2n_long._6_1_;
              c2n_long._7_1_ = SUB41(uVar3,3);
              xp_8._4_1_ = c2n_long._7_1_;
              c2n_long._4_4_ = xp_8._4_4_;
            }
            ref_private_status_reis_bi_8 = 1;
            y_9 = fwrite((void *)((long)&c2n_long + 4),4,1,(FILE *)file);
            if (ref_private_status_reis_bi_8 != y_9) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x809,"ref_gather_cell","int id",ref_private_status_reis_bi_8,y_9);
              return 1;
            }
          }
          else {
            _ref_private_macro_code_rss = *(char **)(&size_per + (long)ncell * 2);
            if (ref_mpi._4_4_ != 0) {
              yp_7 = (char *)&ref_private_macro_code_rss;
              ref_private_status_reis_ai_7 = (REF_LONG)&xp_7;
              xp_7._7_1_ = (undefined1)ref_private_macro_code_rss;
              ref_private_macro_code_rss._1_1_ = SUB81(pcVar2,1);
              xp_7._6_1_ = ref_private_macro_code_rss._1_1_;
              ref_private_macro_code_rss._2_1_ = SUB81(pcVar2,2);
              xp_7._5_1_ = ref_private_macro_code_rss._2_1_;
              ref_private_macro_code_rss._3_1_ = SUB81(pcVar2,3);
              xp_7._4_1_ = ref_private_macro_code_rss._3_1_;
              proc._0_1_ = SUB81(pcVar2,4);
              xp_7._3_1_ = (undefined1)proc;
              proc._1_1_ = SUB81(pcVar2,5);
              xp_7._2_1_ = proc._1_1_;
              proc._2_1_ = SUB81(pcVar2,6);
              xp_7._1_1_ = proc._2_1_;
              proc._3_1_ = SUB81(pcVar2,7);
              xp_7._0_1_ = proc._3_1_;
              _ref_private_macro_code_rss = xp_7;
            }
            ref_private_status_reis_bi_7 = 1;
            sStack_360 = fwrite(&ref_private_macro_code_rss,8,1,(FILE *)file);
            if (ref_private_status_reis_bi_7 != sStack_360) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x805,"ref_gather_cell","long id",ref_private_status_reis_bi_7,sStack_360);
              return 1;
            }
          }
        }
        if (pvStack_1b0 != (void *)0x0) {
          free(pvStack_1b0);
        }
      }
    }
  }
  else {
    c2n._4_4_ = 0;
    for (part = 0; part < _always_id_local->max; part = part + 1) {
      RVar6 = ref_cell_nodes(_always_id_local,part,(REF_INT *)(globals + 0x1b));
      if (RVar6 == 0) {
        uVar7 = ref_cell_part(_always_id_local,(REF_NODE)ref_cell_local,part,&local_44);
        if (uVar7 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x832,"ref_gather_cell",(ulong)uVar7,"part");
          return uVar7;
        }
        if ((_node->id == local_44) &&
           ((select_faceid == 0 || (nodes[(long)_always_id_local->node_per + -2] == faceid)))) {
          c2n._4_4_ = c2n._4_4_ + 1;
        }
      }
    }
    uVar7 = ref_mpi_gather_send(_node,(void *)((long)&c2n + 4),1,1);
    if (uVar7 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x837,"ref_gather_cell",(ulong)uVar7,"send ncell");
      return uVar7;
    }
    if (0 < c2n._4_4_) {
      if (c2n._4_4_ * local_1a0 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x839,"ref_gather_cell","malloc c2n of REF_GLOB negative");
        return 1;
      }
      pvStack_1b0 = malloc((long)(c2n._4_4_ * local_1a0) << 3);
      if (pvStack_1b0 == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x839,"ref_gather_cell","malloc c2n of REF_GLOB NULL");
        return 2;
      }
      c2n._4_4_ = 0;
      for (part = 0; part < _always_id_local->max; part = part + 1) {
        RVar6 = ref_cell_nodes(_always_id_local,part,(REF_INT *)(globals + 0x1b));
        if (RVar6 == 0) {
          uVar7 = ref_cell_part(_always_id_local,(REF_NODE)ref_cell_local,part,&local_44);
          if (uVar7 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x83c,"ref_gather_cell",(ulong)uVar7,"part");
            return uVar7;
          }
          if ((_node->id == local_44) &&
             ((select_faceid == 0 || (nodes[(long)_always_id_local->node_per + -2] == faceid)))) {
            for (local_40 = 0; local_40 < ncell; local_40 = local_40 + 1) {
              if (((nodes[(long)local_40 + -2] < 0) ||
                  (ref_cell_local->last_node_is_an_id <= nodes[(long)local_40 + -2])) ||
                 (*(long *)(*(long *)&ref_cell_local->edge_per +
                           (long)nodes[(long)local_40 + -2] * 8) < 0)) {
                local_470 = 0xffffffffffffffff;
              }
              else {
                local_470 = *(undefined8 *)
                             (*(long *)&ref_cell_local->edge_per +
                             (long)nodes[(long)local_40 + -2] * 8);
              }
              *(undefined8 *)((long)pvStack_1b0 + (long)(local_40 + local_1a0 * c2n._4_4_) * 8) =
                   local_470;
            }
            for (local_40 = ncell; local_40 < local_1a0; local_40 = local_40 + 1) {
              *(long *)((long)pvStack_1b0 + (long)(local_40 + local_1a0 * c2n._4_4_) * 8) =
                   (long)nodes[(long)local_40 + -2];
            }
            c2n._4_4_ = c2n._4_4_ + 1;
          }
        }
      }
      uVar7 = ref_mpi_gather_send(_node,pvStack_1b0,c2n._4_4_ * local_1a0,2);
      if (uVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x848,"ref_gather_cell",(ulong)uVar7,"send c2n");
        return uVar7;
      }
      if (pvStack_1b0 != (void *)0x0) {
        free(pvStack_1b0);
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_cell(
    REF_NODE ref_node, REF_CELL ref_cell, REF_BOOL faceid_insted_of_c2n,
    REF_BOOL always_id, REF_BOOL swap_endian, REF_BOOL sixty_four_bit,
    REF_BOOL select_faceid, REF_INT faceid, REF_BOOL pad, FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT cell, node, part;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_LONG globals[REF_CELL_MAX_SIZE_PER + 1];
  REF_INT node_per = ref_cell_node_per(ref_cell);
  REF_INT size_per = ref_cell_size_per(ref_cell);
  REF_INT ncell;
  REF_GLOB *c2n;
  REF_INT c2n_int;
  REF_LONG c2n_long;
  REF_INT proc;

  if (ref_mpi_once(ref_mpi)) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part &&
          (!select_faceid || nodes[ref_cell_node_per(ref_cell)] == faceid)) {
        for (node = 0; node < node_per; node++)
          globals[node] = ref_node_global(ref_node, nodes[node]) + 1;
        globals[node_per] = REF_EXPORT_MESHB_3D_ID;
        if (size_per > node_per) globals[node_per] = nodes[node_per];

        if (always_id && REF_CELL_PYR == ref_cell_type(ref_cell)) {
          REF_LONG n0, n1, n2, n3, n4;
          /* convention: square basis is 0-1-2-3
             (oriented counter clockwise like trias) and top vertex is 4 */
          n0 = globals[0];
          n1 = globals[3];
          n2 = globals[4];
          n3 = globals[1];
          n4 = globals[2];
          globals[0] = n0;
          globals[1] = n1;
          globals[2] = n2;
          globals[3] = n3;
          globals[4] = n4;
        }

        if (faceid_insted_of_c2n) {
          if (sixty_four_bit) {
            c2n_long = globals[node_per];
            if (swap_endian) SWAP_LONG(c2n_long);
            REIS(1, fwrite(&(c2n_long), sizeof(REF_LONG), 1, file), "long id");
          } else {
            c2n_int = (REF_INT)globals[node_per];
            if (swap_endian) SWAP_INT(c2n_int);
            REIS(1, fwrite(&(c2n_int), sizeof(REF_INT), 1, file), "int id");
          }
        } else {
          for (node = 0; node < node_per; node++) {
            if (sixty_four_bit) {
              c2n_long = globals[node];
              if (swap_endian) SWAP_LONG(c2n_long);
              REIS(1, fwrite(&c2n_long, sizeof(REF_LONG), 1, file),
                   "long cel node");
            } else {
              c2n_int = (REF_INT)globals[node];
              if (swap_endian) SWAP_INT(c2n_int);
              REIS(1, fwrite(&c2n_int, sizeof(REF_INT), 1, file),
                   "int cel node");
            }
          }
          if (pad) {
            REF_INT zero = 0;
            if (swap_endian) SWAP_INT(zero);
            REIS(1, fwrite(&(zero), sizeof(REF_INT), 1, file), "zero pad");
          }
          if (always_id) {
            if (sixty_four_bit) {
              c2n_long = globals[node_per];
              if (swap_endian) SWAP_LONG(c2n_long);
              REIS(1, fwrite(&(c2n_long), sizeof(REF_LONG), 1, file),
                   "long id");
            } else {
              c2n_int = (REF_INT)globals[node_per];
              if (swap_endian) SWAP_INT(c2n_int);
              REIS(1, fwrite(&(c2n_int), sizeof(REF_INT), 1, file), "int id");
            }
          }
        }
      }
    }
  }

  if (ref_mpi_once(ref_mpi)) {
    each_ref_mpi_worker(ref_mpi, proc) {
      RSS(ref_mpi_gather_recv(ref_mpi, &ncell, 1, REF_INT_TYPE, proc),
          "recv ncell");
      if (ncell > 0) {
        ref_malloc(c2n, ncell * size_per, REF_GLOB);
        RSS(ref_mpi_gather_recv(ref_mpi, c2n, ncell * size_per, REF_GLOB_TYPE,
                                proc),
            "recv c2n");
        for (cell = 0; cell < ncell; cell++) {
          for (node = 0; node < node_per; node++)
            globals[node] = c2n[node + size_per * cell] + 1;
          globals[node_per] = REF_EXPORT_MESHB_3D_ID;
          if (size_per > node_per)
            globals[node_per] = c2n[node_per + size_per * cell];

          if (always_id && REF_CELL_PYR == ref_cell_type(ref_cell)) {
            REF_LONG n0, n1, n2, n3, n4;
            /* convention: square basis is 0-1-2-3
               (oriented counter clockwise like trias) and top vertex is 4 */
            n0 = globals[0];
            n1 = globals[3];
            n2 = globals[4];
            n3 = globals[1];
            n4 = globals[2];
            globals[0] = n0;
            globals[1] = n1;
            globals[2] = n2;
            globals[3] = n3;
            globals[4] = n4;
          }

          if (faceid_insted_of_c2n) {
            if (sixty_four_bit) {
              c2n_long = globals[node_per];
              if (swap_endian) SWAP_LONG(c2n_long);
              REIS(1, fwrite(&(c2n_long), sizeof(REF_LONG), 1, file),
                   "long id");
            } else {
              c2n_int = (REF_INT)globals[node_per];
              if (swap_endian) SWAP_INT(c2n_int);
              REIS(1, fwrite(&(c2n_int), sizeof(REF_INT), 1, file), "int id");
            }
          } else {
            for (node = 0; node < node_per; node++) {
              if (sixty_four_bit) {
                c2n_long = globals[node];
                if (swap_endian) SWAP_LONG(c2n_long);
                REIS(1, fwrite(&c2n_long, sizeof(REF_LONG), 1, file),
                     "long cel node");
              } else {
                c2n_int = (REF_INT)globals[node];
                if (swap_endian) SWAP_INT(c2n_int);
                REIS(1, fwrite(&c2n_int, sizeof(REF_INT), 1, file),
                     "int cel node");
              }
            }
            if (pad) {
              REF_INT zero = 0;
              if (swap_endian) SWAP_INT(zero);
              REIS(1, fwrite(&(zero), sizeof(REF_INT), 1, file), "zero pad");
            }
            if (always_id) {
              if (sixty_four_bit) {
                c2n_long = globals[node_per];
                if (swap_endian) SWAP_LONG(c2n_long);
                REIS(1, fwrite(&(c2n_long), sizeof(REF_LONG), 1, file),
                     "long id");
              } else {
                c2n_int = (REF_INT)globals[node_per];
                if (swap_endian) SWAP_INT(c2n_int);
                REIS(1, fwrite(&(c2n_int), sizeof(REF_INT), 1, file), "int id");
              }
            }
          }
        }
        ref_free(c2n);
      }
    }
  } else {
    ncell = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part &&
          (!select_faceid || nodes[ref_cell_node_per(ref_cell)] == faceid))
        ncell++;
    }
    RSS(ref_mpi_gather_send(ref_mpi, &ncell, 1, REF_INT_TYPE), "send ncell");
    if (ncell > 0) {
      ref_malloc(c2n, ncell * size_per, REF_GLOB);
      ncell = 0;
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
        if (ref_mpi_rank(ref_mpi) == part &&
            (!select_faceid || nodes[ref_cell_node_per(ref_cell)] == faceid)) {
          for (node = 0; node < node_per; node++)
            c2n[node + size_per * ncell] =
                ref_node_global(ref_node, nodes[node]);
          for (node = node_per; node < size_per; node++)
            c2n[node + size_per * ncell] = (REF_GLOB)nodes[node];
          ncell++;
        }
      }
      RSS(ref_mpi_gather_send(ref_mpi, c2n, ncell * size_per, REF_GLOB_TYPE),
          "send c2n");
      ref_free(c2n);
    }
  }

  return REF_SUCCESS;
}